

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall Gecko::Graph::optimize(Graph *this,uint n)

{
  Progress *pPVar1;
  int iVar2;
  Subgraph *this_00;
  uint k;
  ulong uVar3;
  ulong uVar4;
  ostringstream count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  long local_198 [2];
  undefined8 auStack_188 [45];
  
  uVar3 = (long)(this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start >> 2;
  uVar4 = uVar3 & 0xffffffff;
  if (n <= uVar3) {
    uVar4 = (ulong)n;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  *(undefined8 *)((long)auStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  pPVar1 = this->progress;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"perm","");
  std::__cxx11::stringbuf::str();
  std::operator+(&local_1b8,&local_1f8,&local_1d8);
  (*pPVar1->_vptr_Progress[6])(pPVar1,this,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  this_00 = (Subgraph *)operator_new(0x508);
  Subgraph::Subgraph(this_00,this,(uint)uVar4);
  uVar3 = 0;
  do {
    iVar2 = (*this->progress->_vptr_Progress[8])();
    if ((char)iVar2 != '\0') break;
    Subgraph::optimize(this_00,(uint)uVar3);
    uVar3 = (ulong)((uint)uVar3 + 1);
  } while (uVar3 <= ((long)(this->perm).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->perm).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2) - uVar4);
  if (this_00->cache != (Subnode *)0x0) {
    operator_delete__(this_00->cache);
  }
  operator_delete(this_00);
  (*this->progress->_vptr_Progress[7])(this->progress,this,1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return;
}

Assistant:

void
Graph::optimize(uint n)
{
  if (n > perm.size())
    n = uint(perm.size());
  ostringstream count;
  count << setw(2) << n;
  progress->beginphase(this, string("perm") + count.str());
  Subgraph* subgraph = new Subgraph(this, n);
  for (uint k = 0; k <= perm.size() - n && !progress->quit(); k++)
    subgraph->optimize(k);
  delete subgraph;
  progress->endphase(this, true);
}